

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

int __thiscall CTPNSymBase::has_return_value_on_call(CTPNSymBase *this)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  CTcPrsSymtab *curtab;
  CTcPrsSymtab *pCVar5;
  long *plVar4;
  
  pCVar5 = G_prs->global_symtab_;
  pcVar1 = this->sym_;
  sVar2 = this->len_;
  do {
    iVar3 = (*pCVar5->_vptr_CTcPrsSymtab[2])(pCVar5,pcVar1,sVar2);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x78))(plVar4);
      iVar3 = (**(code **)(*plVar4 + 0x38))(plVar4);
      return iVar3;
    }
    pCVar5 = pCVar5->parent_;
  } while (pCVar5 != (CTcPrsSymtab *)0x0);
  return 1;
}

Assistant:

int CTPNSymBase::has_return_value_on_call() const
{
    CTcSymbol *sym;
    
    /* try resolving my symbol */
    sym = G_prs->get_global_symtab()->find(sym_, len_);

    /* 
     *   if we found a symbol, let it resolve the call; otherwise, assume
     *   that we do have a return value 
     */
    if (sym != 0)
        return sym->has_return_value_on_call();
    else
        return TRUE;
}